

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O2

Var Js::SCADeserializationEngine::Deserialize
              (StreamReader *reader,Var *transferableVars,size_t cTransferableVars)

{
  scaposition_t root;
  void *pvVar1;
  undefined1 local_58 [8];
  StreamDeserializationCloner cloner;
  uint32 version;
  
  DeserializationCloner<Js::StreamReader>::DeserializationCloner
            ((DeserializationCloner<Js::StreamReader> *)local_58,
             (reader->super_ScriptContextHolder).m_scriptContext,reader);
  StreamReader::Read<unsigned_int>(reader,(uint *)&cloner.field_0x24);
  if (0x1ffffff < (uint)cloner._36_4_) {
    ScriptContextHolder::ThrowSCANewVersion((ScriptContextHolder *)local_58);
  }
  root = StreamReader::GetPosition(reader);
  pvVar1 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                     (root,(DeserializationCloner<Js::StreamReader> *)local_58,transferableVars,
                      cTransferableVars);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)local_58);
}

Assistant:

Var SCADeserializationEngine::Deserialize(StreamReader* reader, Var* transferableVars, size_t cTransferableVars)
    {
        ScriptContext* scriptContext = reader->GetScriptContext();
        StreamDeserializationCloner cloner(scriptContext, reader);

        // Read version
        uint32 version;
        reader->Read(&version);
        if (GetSCAMajor(version) > SCA_FORMAT_MAJOR)
        {
            cloner.ThrowSCANewVersion();
        }
        Var value = SCAEngine<scaposition_t, Var, StreamDeserializationCloner>::Clone(reader->GetPosition(), &cloner, transferableVars, cTransferableVars);
        if (!value)
        {
            cloner.ThrowSCADataCorrupt();
        }

        return value;
    }